

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdConvert<wabt::interp::Simd<double,(unsigned_char)2>,wabt::interp::Simd<float,(unsigned_char)4>,true>
          (Thread *this)

{
  Value value;
  Value VVar1;
  
  VVar1 = Pop(this);
  value.field_0._8_8_ = (double)VVar1.field_0._4_4_;
  value.field_0.f64_ = (f64)(double)(float)VVar1.field_0.f32_;
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdConvert() {
  using SL = typename S::LaneType;
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = Convert<SL>(val[(low ? 0 : S::lanes) + i]);
  }
  Push(result);
  return RunResult::Ok;
}